

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::PicturedInputBufferEnd(Forth *this)

{
  size_t sVar1;
  allocator<char> local_49;
  reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_48;
  reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_40;
  string local_38;
  
  requireDStackDepth(this,2,"#>");
  local_40.current._M_current =
       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        )(this->picturedInputBuffer).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
  local_48.current._M_current =
       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        )(this->picturedInputBuffer).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  std::__cxx11::string::
  string<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
            ((string *)&local_38,&local_40,&local_48,&local_49);
  sVar1 = PutStringToEndOfDataSpace(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  ForthStack<unsigned_int>::setTop(&this->dStack,1,(uint)sVar1);
  ForthStack<unsigned_int>::setTop
            (&this->dStack,
             *(int *)&(this->picturedInputBuffer).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
             *(int *)&(this->picturedInputBuffer).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  return;
}

Assistant:

void PicturedInputBufferEnd(){
			REQUIRE_DSTACK_DEPTH(2, "#>");
			auto dataInDataSpace_ = PutStringToEndOfDataSpace(std::string(picturedInputBuffer.rbegin(), picturedInputBuffer.rend()));
			dStack.setTop(1,CELL(dataInDataSpace_));
			dStack.setTop(CELL(picturedInputBuffer.size()));

		}